

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::HttpHeaderTable::~HttpHeaderTable(HttpHeaderTable *this)

{
  StringPtr *pSVar1;
  RemoveConst<kj::StringPtr> *pRVar2;
  StringPtr *pSVar3;
  ArrayDisposer *pAVar4;
  
  if ((this->idsByName).ptr != (IdsByNameMap *)0x0) {
    (this->idsByName).ptr = (IdsByNameMap *)0x0;
    (**((this->idsByName).disposer)->_vptr_Disposer)();
  }
  pSVar1 = (this->namesById).builder.ptr;
  if (pSVar1 != (StringPtr *)0x0) {
    pRVar2 = (this->namesById).builder.pos;
    pSVar3 = (this->namesById).builder.endPtr;
    (this->namesById).builder.ptr = (StringPtr *)0x0;
    (this->namesById).builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
    (this->namesById).builder.endPtr = (StringPtr *)0x0;
    pAVar4 = (this->namesById).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pSVar1,0x10,(long)pRVar2 - (long)pSVar1 >> 4,(long)pSVar3 - (long)pSVar1 >> 4,
               0);
    return;
  }
  return;
}

Assistant:

HttpHeaderTable::~HttpHeaderTable() noexcept(false) {}